

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::run_for
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this,Cycles cycles)

{
  bool bVar1;
  WrappedInt<Cycles> local_30;
  Cycles local_28;
  HalfCycles local_20;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *local_18;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this_local;
  Cycles cycles_local;
  
  local_18 = this;
  this_local = (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *)
               cycles.super_WrappedInt<Cycles>.length_;
  HalfCycles::HalfCycles(&local_20,(Cycles *)&this_local);
  CPU::Z80::
  Processor<Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>,_false,_false>
  ::run_for(&this->z80_,local_20);
  Cycles::Cycles(&local_28,0);
  bVar1 = WrappedInt<Cycles>::operator>
                    (&(this->duration_to_press_enter_).super_WrappedInt<Cycles>,&local_28);
  if (bVar1) {
    bVar1 = WrappedInt<Cycles>::operator<
                      (&(this->duration_to_press_enter_).super_WrappedInt<Cycles>,
                       (Cycles *)&this_local);
    if (bVar1) {
      Cycles::Cycles((Cycles *)&local_30,0);
      (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_ = local_30.length_;
      ZX::Keyboard::Keyboard::set_key_state(&this->keyboard_,0x601,false);
    }
    else {
      WrappedInt<Cycles>::operator-=
                (&(this->duration_to_press_enter_).super_WrappedInt<Cycles>,(Cycles *)&this_local);
    }
  }
  return;
}

Assistant:

void run_for(const Cycles cycles) override {
			z80_.run_for(cycles);

			// Use this very broad timing base for the automatic enter depression.
			// It's not worth polluting the main loop.
			if(duration_to_press_enter_ > Cycles(0)) {
				if(duration_to_press_enter_ < cycles) {
					duration_to_press_enter_ = Cycles(0);
					keyboard_.set_key_state(ZX::Keyboard::KeyEnter, false);
				} else {
					duration_to_press_enter_ -= cycles;
				}
			}
		}